

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-doc.c
# Opt level: O1

int fy_node_set_vanchorf(fy_node *fyn,char *fmt,__va_list_tag *ap)

{
  fy_document *fyd;
  long lVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  char *pcVar5;
  char *__s;
  char *text;
  undefined8 uStack_60;
  undefined8 uStack_58;
  va_list _ap_orig;
  
  __s = (char *)&uStack_58;
  iVar2 = -1;
  if (fmt != (char *)0x0 && fyn != (fy_node *)0x0) {
    fyd = fyn->fyd;
    _ap_orig[0].overflow_arg_area = ap->reg_save_area;
    uStack_58._0_4_ = ap->gp_offset;
    uStack_58._4_4_ = ap->fp_offset;
    _ap_orig[0]._0_8_ = ap->overflow_arg_area;
    uStack_60 = 0x11c475;
    iVar2 = vsnprintf((char *)0x0,0,fmt,&uStack_58);
    text = (char *)0x0;
    if (iVar2 != -1) {
      lVar1 = -((long)iVar2 + 0x10U & 0xfffffffffffffff0);
      __s = (char *)((long)_ap_orig + lVar1 + -8);
      *(undefined8 *)((long)&uStack_60 + lVar1) = 0x11c4a2;
      iVar3 = vsnprintf(__s,(long)iVar2 + 1,fmt,ap);
      if (iVar2 != iVar3) {
        *(code **)((long)&uStack_60 + lVar1) = fy_node_set_anchorf;
        __assert_fail("_size == _sizew",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-doc.c"
                      ,0x10b,
                      "int fy_node_set_vanchorf(struct fy_node *, const char *, struct __va_list_tag *)"
                     );
      }
      *(undefined8 *)((long)&uStack_60 + lVar1) = 0x11c4af;
      sVar4 = strlen(__s);
      text = __s;
      if (0 < (long)sVar4) {
        pcVar5 = __s + sVar4;
        do {
          if (pcVar5[-1] != '\n') break;
          pcVar5 = pcVar5 + -1;
          *pcVar5 = '\0';
        } while (__s < pcVar5);
      }
    }
    __s[-8] = -0x1c;
    __s[-7] = -0x3c;
    __s[-6] = '\x11';
    __s[-5] = '\0';
    __s[-4] = '\0';
    __s[-3] = '\0';
    __s[-2] = '\0';
    __s[-1] = '\0';
    iVar2 = fy_document_set_anchor_internal(fyd,fyn,text,0xffffffffffffffff,1);
  }
  return iVar2;
}

Assistant:

int fy_node_set_vanchorf(struct fy_node *fyn, const char *fmt, va_list ap) {
    if (!fyn || !fmt)
        return -1;

    return fy_document_set_anchor_internal(fyn->fyd, fyn, alloca_vsprintf(fmt, ap), FY_NT, FYDSAF_COPY);
}